

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

void * dlmalloc(size_t bytes)

{
  mchunkptr pmVar1;
  malloc_chunk *pmVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  mchunkptr pmVar8;
  byte bVar9;
  bool bVar10;
  ulong local_e0;
  mchunkptr r_2;
  mchunkptr p_3;
  size_t rsize_2;
  size_t dvs;
  mchunkptr r_1;
  mchunkptr p_2;
  size_t rsize_1;
  mchunkptr F_2;
  mchunkptr B;
  bindex_t I;
  mchunkptr DV;
  size_t DVS;
  mchunkptr F_1;
  uint J;
  binmap_t leastbit;
  binmap_t leftbits;
  bindex_t i;
  size_t rsize;
  mchunkptr r;
  mchunkptr p_1;
  mchunkptr b_1;
  mchunkptr F;
  mchunkptr p;
  mchunkptr b;
  binmap_t smallbits;
  bindex_t idx;
  size_t nb;
  void *mem;
  size_t bytes_local;
  
  if (bytes < 0xe9) {
    if (bytes < 0x17) {
      local_e0 = 0x20;
    }
    else {
      local_e0 = bytes + 0x17 & 0xfffffffffffffff0;
    }
    _smallbits = local_e0;
    bVar9 = (byte)(local_e0 >> 3);
    uVar3 = _gm_.smallmap >> (bVar9 & 0x1f);
    if ((uVar3 & 3) != 0) {
      iVar4 = ((uVar3 ^ 0xffffffff) & 1) + (int)(local_e0 >> 3);
      uVar7 = (ulong)(uint)(iVar4 * 2);
      pmVar1 = _gm_.smallbins[uVar7 + 2];
      pmVar2 = pmVar1->fd;
      if ((malloc_chunk *)(_gm_.smallbins + uVar7) == pmVar2) {
        _gm_.smallmap = (1 << ((byte)iVar4 & 0x1f) ^ 0xffffffffU) & _gm_.smallmap;
      }
      else {
        bVar10 = false;
        if (_gm_.least_addr <= pmVar2) {
          bVar10 = pmVar2->bk == pmVar1;
        }
        if (!bVar10) {
          abort();
        }
        pmVar2->bk = (malloc_chunk *)(_gm_.smallbins + uVar7);
        _gm_.smallbins[uVar7 + 2] = pmVar2;
      }
      pmVar1->head = (ulong)(uint)(iVar4 * 8) | 3;
      *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar4 * 8)) =
           *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar4 * 8)) | 1;
      return &pmVar1->fd;
    }
    if (local_e0 <= _gm_.dvsize) goto LAB_001078c3;
    if (uVar3 != 0) {
      uVar3 = uVar3 << (bVar9 & 0x1f) & ((1 << (bVar9 & 0x1f)) << 1 | (1 << (bVar9 & 0x1f)) * -2);
      iVar4 = 0;
      for (uVar3 = uVar3 & -uVar3; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
        iVar4 = iVar4 + 1;
      }
      uVar7 = (ulong)(uint)(iVar4 << 1);
      pmVar1 = _gm_.smallbins[uVar7 + 2];
      pmVar2 = pmVar1->fd;
      if ((malloc_chunk *)(_gm_.smallbins + uVar7) == pmVar2) {
        _gm_.smallmap = (1 << ((byte)iVar4 & 0x1f) ^ 0xffffffffU) & _gm_.smallmap;
      }
      else {
        bVar10 = false;
        if (_gm_.least_addr <= pmVar2) {
          bVar10 = pmVar2->bk == pmVar1;
        }
        if (!bVar10) {
          abort();
        }
        pmVar2->bk = (malloc_chunk *)(_gm_.smallbins + uVar7);
        _gm_.smallbins[uVar7 + 2] = pmVar2;
      }
      sVar5 = (uint)(iVar4 << 3) - local_e0;
      if (sVar5 < 0x20) {
        pmVar1->head = (ulong)(uint)(iVar4 << 3) | 3;
        *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar4 << 3)) =
             *(ulong *)((long)&pmVar1->head + (ulong)(uint)(iVar4 << 3)) | 1;
        sVar5 = _gm_.dvsize;
        pmVar8 = _gm_.dv;
      }
      else {
        pmVar1->head = local_e0 | 3;
        pmVar8 = (mchunkptr)((long)&pmVar1->prev_foot + local_e0);
        pmVar8->head = sVar5 | 1;
        *(size_t *)((long)pmVar8 + sVar5) = sVar5;
        if (_gm_.dvsize != 0) {
          uVar7 = (ulong)(uint)((int)(_gm_.dvsize >> 3) << 1);
          bVar9 = (byte)(_gm_.dvsize >> 3);
          if ((_gm_.smallmap & 1 << (bVar9 & 0x1f)) == 0) {
            _gm_.smallmap = 1 << (bVar9 & 0x1f) | _gm_.smallmap;
            rsize_1 = (size_t)(_gm_.smallbins + uVar7);
          }
          else {
            if (_gm_.smallbins[uVar7 + 2] < _gm_.least_addr) {
              abort();
            }
            rsize_1 = (size_t)_gm_.smallbins[uVar7 + 2];
          }
          _gm_.smallbins[uVar7 + 2] = _gm_.dv;
          *(mchunkptr *)(rsize_1 + 0x18) = _gm_.dv;
          (_gm_.dv)->fd = (malloc_chunk *)rsize_1;
          (_gm_.dv)->bk = (malloc_chunk *)(_gm_.smallbins + uVar7);
        }
      }
      _gm_.dv = pmVar8;
      _gm_.dvsize = sVar5;
      return &pmVar1->fd;
    }
    if (_gm_.treemap == 0) goto LAB_001078c3;
    pvVar6 = tmalloc_small(&_gm_,local_e0);
  }
  else {
    if (0xffffffffffffff7f < bytes) {
      _smallbits = 0xffffffffffffffff;
      goto LAB_001078c3;
    }
    _smallbits = bytes + 0x17 & 0xfffffffffffffff0;
    if (_gm_.treemap == 0) goto LAB_001078c3;
    pvVar6 = tmalloc_large(&_gm_,_smallbits);
  }
  if (pvVar6 != (void *)0x0) {
    return pvVar6;
  }
LAB_001078c3:
  pmVar8 = _gm_.top;
  pmVar1 = _gm_.dv;
  sVar5 = _gm_.dvsize;
  if (_gm_.dvsize < _smallbits) {
    if (_smallbits < _gm_.topsize) {
      _gm_.topsize = _gm_.topsize - _smallbits;
      _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + _smallbits);
      (_gm_.top)->head = _gm_.topsize | 1;
      pmVar8->head = _smallbits | 3;
      nb = (size_t)&pmVar8->fd;
    }
    else {
      nb = (size_t)sys_alloc(&_gm_,_smallbits);
    }
  }
  else {
    uVar7 = _gm_.dvsize - _smallbits;
    if (uVar7 < 0x20) {
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      pmVar1->head = sVar5 | 3;
      *(ulong *)((long)&pmVar1->head + sVar5) = *(ulong *)((long)&pmVar1->head + sVar5) | 1;
    }
    else {
      pmVar8 = (mchunkptr)((long)&(_gm_.dv)->prev_foot + _smallbits);
      _gm_.dvsize = uVar7;
      _gm_.dv = pmVar8;
      pmVar8->head = uVar7 | 1;
      *(ulong *)((long)pmVar8 + uVar7) = uVar7;
      pmVar1->head = _smallbits | 3;
    }
    nb = (size_t)&pmVar1->fd;
  }
  return (void *)nb;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}